

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int FE_Insert_Line(FORM *form)

{
  FIELD *field;
  _Bool _Var1;
  
  field = form->current;
  _Var1 = Check_Char(field->type,0x20,(TypeArgument *)field->arg);
  if (!_Var1) {
    return -0xc;
  }
  if (form->currow == field->drows + -1) {
    if ((int)field->rows + field->nrow == 1) {
      return -0xc;
    }
  }
  else {
    _Var1 = Is_There_Room_For_A_Line(form);
    if ((int)field->rows + field->nrow == 1) {
      return -0xc;
    }
    if (_Var1) goto LAB_00456d6d;
  }
  if ((field->status & 8) == 0) {
    return -0xc;
  }
  _Var1 = Field_Grown(field,1);
  if (!_Var1) {
    return -1;
  }
LAB_00456d6d:
  form->curcol = 0;
  winsdelln(form->w,1);
  return 0;
}

Assistant:

static int FE_Insert_Line(FORM * form)
{
  FIELD *field = form->current;
  int result = E_REQUEST_DENIED;

  if (Check_Char(field->type,(int)C_BLANK,(TypeArgument *)(field->arg)))
    {
      bool Maybe_Done = (form->currow!=(field->drows-1)) && 
                        Is_There_Room_For_A_Line(form);

      if (!Single_Line_Field(field) &&
          (Maybe_Done || Growable(field)))
        {
          if (!Maybe_Done && !Field_Grown(field,1))
            result = E_SYSTEM_ERROR;
          else
            {
              form->curcol = 0;
              winsertln(form->w);
              result = E_OK;
            }
        }
    }
  return result;
}